

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::~InputFile(InputFile *this)

{
  _func_int **pp_Var1;
  GenericInputFile *in_RDI;
  Data *unaff_retaddr;
  
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__InputFile_0040d150;
  if ((((ulong)in_RDI[1]._vptr_GenericInputFile[0x20] & 1) != 0) &&
     (*(long **)(in_RDI[1]._vptr_GenericInputFile[0x1f] + 0x28) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x1f] + 0x28) + 8))();
  }
  if (((*(int *)((long)in_RDI[1]._vptr_GenericInputFile + 0xdc) == -1) &&
      (in_RDI[1]._vptr_GenericInputFile[0x1f] != (_func_int *)0x0)) &&
     (in_RDI[1]._vptr_GenericInputFile[0x1f] != (_func_int *)0x0)) {
    operator_delete(in_RDI[1]._vptr_GenericInputFile[0x1f],0x38);
  }
  if ((in_RDI[1]._vptr_GenericInputFile != (_func_int **)0x0) &&
     (pp_Var1 = in_RDI[1]._vptr_GenericInputFile, pp_Var1 != (_func_int **)0x0)) {
    Data::~Data(unaff_retaddr);
    operator_delete(pp_Var1,0x108);
  }
  GenericInputFile::~GenericInputFile(in_RDI);
  return;
}

Assistant:

InputFile::~InputFile ()
{
    if (_data->_deleteStream)
        delete _data->_streamData->is;

    // unless this file was opened via the multipart API,
    // delete the streamData object too
    if (_data->partNumber==-1 && _data->_streamData)
        delete _data->_streamData;

    if (_data)  delete _data;
}